

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O3

PyObject * libxml_xmlSetValidErrors(PyObject *self,PyObject *args)

{
  int iVar1;
  undefined8 *puVar2;
  PyObject *pPVar3;
  undefined8 *puVar4;
  PyObject *pyobj_arg;
  PyObject *pyobj_ctx;
  PyObject *pyobj_warn;
  PyObject *pyobj_error;
  undefined *local_20;
  long *local_18;
  long *local_10;
  
  pPVar3 = (PyObject *)0x0;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"OOO|O:xmlSetValidErrors",&local_20,&local_10,&local_18);
  if (iVar1 != 0) {
    if (local_20 == &_Py_NoneStruct) {
      puVar4 = (undefined8 *)0x0;
    }
    else {
      puVar4 = *(undefined8 **)(local_20 + 0x10);
    }
    puVar2 = (undefined8 *)(*_xmlMalloc)(0x18);
    if (puVar2 == (undefined8 *)0x0) {
      iVar1 = -1;
    }
    else {
      *puVar2 = 0;
      puVar2[1] = 0;
      puVar2[2] = 0;
      if (local_10 != (long *)0x0) {
        *local_10 = *local_10 + 1;
      }
      puVar2[1] = local_10;
      if (local_18 != (long *)0x0) {
        *local_18 = *local_18 + 1;
      }
      *puVar2 = local_18;
      __Py_NoneStruct = __Py_NoneStruct + 1;
      puVar2[2] = &_Py_NoneStruct;
      puVar4[1] = libxml_xmlValidCtxtErrorFuncHandler;
      puVar4[2] = libxml_xmlValidCtxtWarningFuncHandler;
      *puVar4 = puVar2;
      iVar1 = 1;
    }
    pPVar3 = libxml_intWrap(iVar1);
  }
  return pPVar3;
}

Assistant:

static PyObject *
libxml_xmlSetValidErrors(ATTRIBUTE_UNUSED PyObject * self, PyObject * args)
{
    PyObject *py_retval;
    PyObject *pyobj_error;
    PyObject *pyobj_warn;
    PyObject *pyobj_ctx;
    PyObject *pyobj_arg = Py_None;
    xmlValidCtxtPtr ctxt;
    xmlValidCtxtPyCtxtPtr pyCtxt;

    if (!PyArg_ParseTuple
        (args, (char *) "OOO|O:xmlSetValidErrors", &pyobj_ctx, &pyobj_error, &pyobj_warn, &pyobj_arg))
        return (NULL);

#ifdef DEBUG_ERROR
    printf("libxml_xmlSetValidErrors(%p, %p, %p) called\n", pyobj_ctx, pyobj_error, pyobj_warn);
#endif

    ctxt = PyValidCtxt_Get(pyobj_ctx);
    pyCtxt = xmlMalloc(sizeof(xmlValidCtxtPyCtxt));
    if (pyCtxt == NULL) {
            py_retval = libxml_intWrap(-1);
            return(py_retval);
    }
    memset(pyCtxt, 0, sizeof(xmlValidCtxtPyCtxt));

    
    /* TODO: check warn and error is a function ! */
    Py_XDECREF(pyCtxt->error);
    Py_XINCREF(pyobj_error);
    pyCtxt->error = pyobj_error;
    
    Py_XDECREF(pyCtxt->warn);
    Py_XINCREF(pyobj_warn);
    pyCtxt->warn = pyobj_warn;
    
    Py_XDECREF(pyCtxt->arg);
    Py_XINCREF(pyobj_arg);
    pyCtxt->arg = pyobj_arg;

    ctxt->error = libxml_xmlValidCtxtErrorFuncHandler;
    ctxt->warning = libxml_xmlValidCtxtWarningFuncHandler;
    ctxt->userData = pyCtxt;

    py_retval = libxml_intWrap(1);
    return (py_retval);
}